

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O2

PipelineResourceSignatureDescWrapper *
Diligent::PipelineStateVkImpl::GetDefaultResourceSignatureDesc
          (PipelineResourceSignatureDescWrapper *__return_storage_ptr__,TShaderStages *ShaderStages,
          char *PSOName,PipelineResourceLayoutDesc *ResourceLayout,Uint32 SRBAllocationGranularity)

{
  char *pcVar1;
  long lVar2;
  SHADER_RESOURCE_TYPE SVar3;
  PIPELINE_RESOURCE_FLAGS PVar4;
  pointer ppSVar5;
  shared_ptr<const_Diligent::SPIRVShaderResources> *psVar6;
  SPIRVShaderResourceAttribs *Args;
  char *CombinedSamplerSuffix;
  uint n;
  element_type *this;
  pointer pSVar7;
  ShaderResourceVariableDesc SVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>,_false,_false>,_bool>
  pVar9;
  PIPELINE_RESOURCE_FLAGS local_d9;
  PipelineResourceSignatureDescWrapper *local_d8;
  char *local_d0;
  uint local_c4;
  ShaderVkImpl *local_c0;
  element_type *local_b8;
  SHADER_RESOURCE_TYPE ResType;
  undefined7 uStack_af;
  Char *local_98;
  SHADER_TYPE local_90;
  undefined2 local_8c [2];
  pointer local_88;
  pointer local_80;
  pointer local_78;
  PipelineResourceLayoutDesc *local_70;
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>_>_>
  UniqueResources;
  
  local_d8 = __return_storage_ptr__;
  local_70 = ResourceLayout;
  PipelineResourceSignatureDescWrapper::PipelineResourceSignatureDescWrapper
            (__return_storage_ptr__,PSOName,ResourceLayout,SRBAllocationGranularity);
  UniqueResources._M_h._M_buckets = &UniqueResources._M_h._M_single_bucket;
  UniqueResources._M_h._M_bucket_count = 1;
  UniqueResources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  UniqueResources._M_h._M_element_count = 0;
  UniqueResources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  UniqueResources._M_h._M_rehash_policy._M_next_resize = 0;
  UniqueResources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pSVar7 = (ShaderStages->
           super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_88 = (ShaderStages->
             super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = "";
  if (PSOName != (char *)0x0) {
    local_d0 = PSOName;
  }
  for (; pSVar7 != local_88; pSVar7 = pSVar7 + 1) {
    local_80 = (pSVar7->Shaders).
               super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    ppSVar5 = (pSVar7->Shaders).
              super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (ppSVar5 != local_80) {
      local_c0 = *ppSVar5;
      local_78 = ppSVar5;
      psVar6 = ShaderVkImpl::GetShaderResources(local_c0);
      this = (psVar6->
             super___shared_ptr<const_Diligent::SPIRVShaderResources,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
      local_c0 = (ShaderVkImpl *)
                 &(local_c0->super_ShaderBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IShaderVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderDesc>
                  .m_Desc;
      n = 0;
      local_b8 = this;
      while (n < this->m_TotalResources) {
        local_c4 = n;
        Args = SPIRVShaderResources::GetResource(this,n);
        pcVar1 = this->m_CombinedSamplerSuffix;
        CombinedSamplerSuffix = (char *)0x0;
        if (Args->Type == SeparateSampler) {
          CombinedSamplerSuffix = pcVar1;
        }
        if (pcVar1 == (char *)0x0) {
          CombinedSamplerSuffix = pcVar1;
        }
        SVar8 = FindPipelineResourceLayoutVariable
                          (local_70,Args->Name,pSVar7->Type,CombinedSamplerSuffix);
        local_98 = SVar8.Name;
        local_90 = SVar8.ShaderStages;
        local_8c[0] = SVar8._12_2_;
        ShaderResourceHashKey::ShaderResourceHashKey<char_const*const&>
                  ((ShaderResourceHashKey *)&ResType,local_90,&Args->Name);
        pVar9 = std::
                _Hashtable<Diligent::ShaderResourceHashKey,std::pair<Diligent::ShaderResourceHashKey_const,Diligent::SPIRVShaderResourceAttribs_const&>,std::allocator<std::pair<Diligent::ShaderResourceHashKey_const,Diligent::SPIRVShaderResourceAttribs_const&>>,std::__detail::_Select1st,std::equal_to<Diligent::ShaderResourceHashKey>,Diligent::ShaderResourceHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::
                _M_emplace<Diligent::ShaderResourceHashKey,Diligent::SPIRVShaderResourceAttribs_const&>
                          ((_Hashtable<Diligent::ShaderResourceHashKey,std::pair<Diligent::ShaderResourceHashKey_const,Diligent::SPIRVShaderResourceAttribs_const&>,std::allocator<std::pair<Diligent::ShaderResourceHashKey_const,Diligent::SPIRVShaderResourceAttribs_const&>>,std::__detail::_Select1st,std::equal_to<Diligent::ShaderResourceHashKey>,Diligent::ShaderResourceHashKey::Hasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)&UniqueResources,(ShaderResourceHashKey *)&ResType,Args);
        HashMapStringKey::Clear((HashMapStringKey *)&ResType);
        this = local_b8;
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          lVar2 = *(long *)((long)pVar9.first.
                                  super__Node_iterator_base<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>,_false>
                                  ._M_cur.
                                  super__Node_iterator_base<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>,_false>
                           + 0x20);
          if (*(ResourceType *)(lVar2 + 10) != Args->Type) {
            _ResType = local_d0;
            LogError<true,char[18],char_const*,char[51],char_const*,char[229]>
                      (false,"VerifyResourceMerge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                       ,0x21d,(char (*) [18])"Shader variable \'",&Args->Name,
                       (char (*) [51])"\' is shared between multiple shaders in pipeline \'",
                       (char **)&ResType,
                       (char (*) [229])
                       "\', but its type varies. A variable shared between multiple shaders must be defined identically in all shaders. Either use separate variables for different shader stages, change resource name or make sure that type is consistent."
                      );
          }
          if (((Args->field_0xb ^ *(byte *)(lVar2 + 0xb)) & 0x7f) != 0) {
            _ResType = local_d0;
            LogError<true,char[18],char_const*,char[51],char_const*,char[257]>
                      (false,"VerifyResourceMerge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                       ,0x220,(char (*) [18])"Shader variable \'",&Args->Name,
                       (char (*) [51])"\' is shared between multiple shaders in pipeline \'",
                       (char **)&ResType,
                       (char (*) [257])
                       "\', but its resource dimension varies. A variable shared between multiple shaders must be defined identically in all shaders. Either use separate variables for different shader stages, change resource name or make sure that resource dimension is consistent."
                      );
          }
          if (*(Uint16 *)(lVar2 + 8) != Args->ArraySize) {
            _ResType = local_d0;
            LogError<true,char[18],char_const*,char[51],char_const*,char[241]>
                      (false,"VerifyResourceMerge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                       ,0x223,(char (*) [18])"Shader variable \'",&Args->Name,
                       (char (*) [51])"\' is shared between multiple shaders in pipeline \'",
                       (char **)&ResType,
                       (char (*) [241])
                       "\', but its array size varies. A variable shared between multiple shaders must be defined identically in all shaders. Either use separate variables for different shader stages, change resource name or make sure that array size is consistent."
                      );
          }
          if ((char)(Args->field_0xb ^ *(byte *)(lVar2 + 0xb)) < '\0') {
            _ResType = local_d0;
            LogError<true,char[18],char_const*,char[51],char_const*,char[255]>
                      (false,"VerifyResourceMerge",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                       ,0x226,(char (*) [18])"Shader variable \'",&Args->Name,
                       (char (*) [51])"\' is shared between multiple shaders in pipeline \'",
                       (char **)&ResType,
                       (char (*) [255])
                       "\', but its multisample state varies. A variable shared between multiple shaders must be defined identically in all shaders. Either use separate variables for different shader stages, change resource name or make sure that multisample state is consistent."
                      );
          }
        }
        else {
          if (Args->ArraySize == 0) {
            LogError<true,char[11],char_const*,char[14],char_const*,char[29],char[68]>
                      (false,"operator()",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                       ,0x277,(char (*) [11])"Resource \'",&Args->Name,
                       (char (*) [14])"\' in shader \'",(char **)local_c0,
                       (char (*) [29])"\' is a runtime-sized array. ",
                       (char (*) [68])
                       "You must use explicit resource signature to specify the array size.");
          }
          SVar3 = SPIRVShaderResourceAttribs::GetShaderResourceType(Args->Type);
          _ResType = (char *)CONCAT71(uStack_af,SVar3);
          PVar4 = SPIRVShaderResourceAttribs::GetPipelineResourceFlags(Args->Type);
          local_d9 = ShaderVariableFlagsToPipelineResourceFlags(SVar8.Flags);
          local_d9 = local_d9 | PVar4;
          PipelineResourceSignatureDescWrapper::
          AddResource<Diligent::SHADER_TYPE_const&,char_const*const&,unsigned_short_const&,Diligent::SHADER_RESOURCE_TYPE_const&,Diligent::SHADER_RESOURCE_VARIABLE_TYPE_const&,Diligent::PIPELINE_RESOURCE_FLAGS_const&>
                    (local_d8,&local_90,&Args->Name,&Args->ArraySize,&ResType,
                     (SHADER_RESOURCE_VARIABLE_TYPE *)local_8c,&local_d9);
        }
        n = local_c4 + 1;
      }
      if ((this->m_CombinedSamplerSuffix != (char *)0x0) &&
         (this->m_SeparateImageOffset != this->m_SeparateSamplerOffset)) {
        PipelineResourceSignatureDescWrapper::SetCombinedSamplerSuffix
                  (local_d8,this->m_CombinedSamplerSuffix);
      }
      ppSVar5 = local_78 + 1;
    }
  }
  std::
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::SPIRVShaderResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&UniqueResources._M_h);
  return local_d8;
}

Assistant:

PipelineResourceSignatureDescWrapper PipelineStateVkImpl::GetDefaultResourceSignatureDesc(
    const TShaderStages&              ShaderStages,
    const char*                       PSOName,
    const PipelineResourceLayoutDesc& ResourceLayout,
    Uint32                            SRBAllocationGranularity) noexcept(false)
{
    PipelineResourceSignatureDescWrapper SignDesc{PSOName, ResourceLayout, SRBAllocationGranularity};

    std::unordered_map<ShaderResourceHashKey, const SPIRVShaderResourceAttribs&, ShaderResourceHashKey::Hasher> UniqueResources;
    for (const ShaderStageInfo& Stage : ShaderStages)
    {
        for (const ShaderVkImpl* pShader : Stage.Shaders)
        {
            const SPIRVShaderResources& ShaderResources = *pShader->GetShaderResources();
            ShaderResources.ProcessResources(
                [&](const SPIRVShaderResourceAttribs& Attribs, Uint32) //
                {
                    // We can't skip immutable samplers because immutable sampler arrays have to be defined
                    // as both resource and sampler.
                    //if (Res.Type == SPIRVShaderResourceAttribs::SeparateSampler &&
                    //    FindImmutableSampler(ResourceLayout.ImmutableSamplers, ResourceLayout.NumImmutableSamplers, Stage.Type, Res.Name,
                    //                         ShaderResources.GetCombinedSamplerSuffix()) >= 0)
                    //{
                    //    // Skip separate immutable samplers - they are not resources
                    //    return;
                    //}

                    const char* const SamplerSuffix =
                        (ShaderResources.IsUsingCombinedSamplers() && Attribs.Type == SPIRVShaderResourceAttribs::ResourceType::SeparateSampler) ?
                        ShaderResources.GetCombinedSamplerSuffix() :
                        nullptr;

                    const ShaderResourceVariableDesc VarDesc = FindPipelineResourceLayoutVariable(ResourceLayout, Attribs.Name, Stage.Type, SamplerSuffix);
                    // Note that Attribs.Name != VarDesc.Name for combined samplers
                    const auto it_assigned = UniqueResources.emplace(ShaderResourceHashKey{VarDesc.ShaderStages, Attribs.Name}, Attribs);
                    if (it_assigned.second)
                    {
                        if (Attribs.ArraySize == 0)
                        {
                            LOG_ERROR_AND_THROW("Resource '", Attribs.Name, "' in shader '", pShader->GetDesc().Name, "' is a runtime-sized array. ",
                                                "You must use explicit resource signature to specify the array size.");
                        }

                        const SHADER_RESOURCE_TYPE    ResType = SPIRVShaderResourceAttribs::GetShaderResourceType(Attribs.Type);
                        const PIPELINE_RESOURCE_FLAGS Flags   = SPIRVShaderResourceAttribs::GetPipelineResourceFlags(Attribs.Type) | ShaderVariableFlagsToPipelineResourceFlags(VarDesc.Flags);
                        SignDesc.AddResource(VarDesc.ShaderStages, Attribs.Name, Attribs.ArraySize, ResType, VarDesc.Type, Flags);
                    }
                    else
                    {
                        VerifyResourceMerge(PSOName, it_assigned.first->second, Attribs);
                    }
                });

            // Merge combined sampler suffixes
            if (ShaderResources.IsUsingCombinedSamplers() && ShaderResources.GetNumSepSmplrs() > 0)
            {
                SignDesc.SetCombinedSamplerSuffix(ShaderResources.GetCombinedSamplerSuffix());
            }
        }
    }

    return SignDesc;
}